

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  word *pwVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar;
  ulong uVar12;
  word *pwVar13;
  ulong uVar14;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x5b6,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  uVar4 = 1 << ((char)nVarsAll - 6U & 0x1f);
  uVar14 = 0;
  uVar11 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar11 = uVar14;
  }
  uVar6 = 0;
  if (0 < nVars) {
    uVar6 = (ulong)(uint)nVars;
  }
  iVar = 0;
  do {
    if (uVar14 == uVar6) {
      if (nVars < iVar) {
        __assert_fail("k < nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x5c4,"int Abc_TtMinBase(word *, int *, int, int)");
      }
      return iVar;
    }
    if (nVarsAll < 7) {
      iVar5 = Abc_Tt6HasVar(*pTruth,(int)uVar14);
      if (iVar5 != 0) {
LAB_005cb56e:
        if ((long)iVar < (long)uVar14) {
          if (pVars != (int *)0x0) {
            pVars[iVar] = pVars[uVar14];
          }
          Abc_TtSwapVars(pTruth,nVarsAll,iVar,(int)uVar14);
        }
        iVar = iVar + 1;
      }
    }
    else {
      if (uVar14 < 6) {
        uVar10 = 0;
        do {
          if (uVar11 == uVar10) goto LAB_005cb599;
          puVar1 = pTruth + uVar10;
          uVar10 = uVar10 + 1;
        } while ((s_Truths6Neg[uVar14] &
                 (*puVar1 >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) ^ *puVar1)) == 0);
        goto LAB_005cb56e;
      }
      bVar7 = (byte)uVar14 - 6;
      uVar10 = (ulong)(uint)(1 << (bVar7 & 0x1f));
      uVar9 = 2 << (bVar7 & 0x1f);
      pwVar8 = pTruth + uVar10;
      for (pwVar13 = pTruth; pwVar13 < pTruth + (int)uVar4; pwVar13 = pwVar13 + uVar9) {
        uVar12 = 0;
        while (uVar10 != uVar12) {
          pwVar2 = pwVar13 + uVar12;
          pwVar3 = pwVar8 + uVar12;
          uVar12 = uVar12 + 1;
          if (*pwVar2 != *pwVar3) goto LAB_005cb56e;
        }
        pwVar8 = pwVar8 + uVar9;
      }
    }
LAB_005cb599:
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}